

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

bool __thiscall
glslang::TSymbolValidater::qualifierCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  pointer pcVar1;
  TSymbolValidater *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined3 in_register_00000081;
  bool bVar6;
  string errorStr;
  long *local_58 [2];
  long local_48 [2];
  TSymbolValidater *local_38;
  long lVar4;
  undefined4 extraout_var_00;
  
  local_38 = this;
  iVar3 = (*type1->_vptr_TType[0xb])(type1);
  lVar4 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*type2->_vptr_TType[0xb])(type2);
  lVar5 = CONCAT44(extraout_var_00,iVar3);
  if (CONCAT31(in_register_00000081,isBlock) == 0) {
    iVar3 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x7f) != 5) goto LAB_0047e443;
    iVar3 = (*type2->_vptr_TType[0xb])(type2);
    if ((*(uint *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0x7f) != 5) goto LAB_0047e443;
LAB_0047e474:
    bVar6 = ((*(uint *)(lVar5 + 8) ^ *(uint *)(lVar4 + 8)) & 0xe000000) != 0;
    if (bVar6) {
      local_58[0] = local_48;
      pcVar1 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&local_38->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
    }
    if (((*(char *)(lVar4 + 0x2c) != '\0') && (*(char *)(lVar5 + 0x2c) != '\0')) &&
       (*(char *)(lVar4 + 0x2c) != *(char *)(lVar5 + 0x2c))) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&local_38->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar6 = true;
    }
  }
  else {
LAB_0047e443:
    iVar3 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_03,iVar3) + 8) & 0x7f) == 1) {
      iVar3 = (*type2->_vptr_TType[0xb])(type2);
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) == 1) goto LAB_0047e474;
    }
    bVar6 = false;
  }
  pTVar2 = local_38;
  if (isBlock) {
    if (((*(byte *)(lVar5 + 0x10) ^ *(byte *)(lVar4 + 0x10)) & 0xf) != 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar6 = true;
    }
    if ((*(ulong *)(lVar5 + 8) ^ *(ulong *)(lVar4 + 8)) >> 0x3d != 0) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar6 = true;
    }
    if (*(int *)(lVar4 + 0x14) != *(int *)(lVar5 + 0x14)) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar6 = true;
    }
    if (*(int *)(lVar4 + 0x18) != *(int *)(lVar5 + 0x18)) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      TInfoSinkBase::message(&pTVar2->infoSink->info,EPrefixError,(char *)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool qualifierCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        const TQualifier& qualifier1 = type1->getQualifier();
        const TQualifier& qualifier2 = type2->getQualifier();

        if (((isBlock == false) &&
            (type1->getQualifier().storage == EvqUniform && type2->getQualifier().storage == EvqUniform)) ||
            (type1->getQualifier().storage == EvqGlobal && type2->getQualifier().storage == EvqGlobal)) {
            if (qualifier1.precision != qualifier2.precision) {
                hasError = true;
                std::string errorStr = name + ": have precision conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.hasFormat() && qualifier2.hasFormat()) {
                if (qualifier1.layoutFormat != qualifier2.layoutFormat) {
                    hasError = true;
                    std::string errorStr = name + ": have layout format conflict cross stage.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                }

            }
        }

        if (isBlock == true) {
            if (qualifier1.layoutPacking != qualifier2.layoutPacking) {
                hasError = true;
                std::string errorStr = name + ": have layoutPacking conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutMatrix != qualifier2.layoutMatrix) {
                hasError = true;
                std::string errorStr = name + ": have layoutMatrix conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutOffset != qualifier2.layoutOffset) {
                hasError = true;
                std::string errorStr = name + ": have layoutOffset conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutAlign != qualifier2.layoutAlign) {
                hasError = true;
                std::string errorStr = name + ": have layoutAlign conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
        }

        return hasError;
    }